

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus
debugAnalysePrimalDualErrors(HighsOptions *options,HighsPrimalDualErrors *primal_dual_errors)

{
  double dVar1;
  int iVar2;
  HighsLogType HVar3;
  HighsLogType HVar4;
  HighsLogType HVar5;
  string value_adjective;
  
  value_adjective._M_dataplus._M_p = (pointer)&value_adjective.field_2;
  value_adjective._M_string_length = 0;
  value_adjective.field_2._M_local_buf[0] = '\0';
  iVar2 = (options->super_HighsOptionsStruct).highs_debug_level;
  HVar3 = kInfo;
  if (primal_dual_errors->num_nonzero_basic_duals < 0) {
    HVar4 = 0;
  }
  else {
    if (primal_dual_errors->num_nonzero_basic_duals == 0) {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar5 = kVerbose;
      HVar4 = 0;
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar5 = kError;
      HVar4 = kWarning|kDetailed;
    }
    if (1 < iVar2) {
      HVar5 = HVar3;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar5,
                "PrDuErrors : %-9s Nonzero basic duals:       num = %7d; max = %9.4g; sum = %9.4g\n"
                ,primal_dual_errors->max_nonzero_basic_dual,
                primal_dual_errors->sum_nonzero_basic_duals,value_adjective._M_dataplus._M_p,
                (ulong)(uint)primal_dual_errors->num_nonzero_basic_duals);
  }
  if (-1 < primal_dual_errors->num_off_bound_nonbasic) {
    if (primal_dual_errors->num_off_bound_nonbasic == 0) {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar5 = kVerbose;
      HVar4 = 0;
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar4 = kWarning|kDetailed;
      HVar5 = kError;
    }
    if (1 < iVar2) {
      HVar5 = HVar3;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar5,
                "PrDuErrors : %-9s Off-bound nonbasic values: num = %7d; max = %9.4g; sum = %9.4g\n"
                ,primal_dual_errors->max_off_bound_nonbasic,
                primal_dual_errors->sum_off_bound_nonbasic,value_adjective._M_dataplus._M_p,
                (ulong)(uint)primal_dual_errors->num_off_bound_nonbasic);
  }
  if (-1 < primal_dual_errors->num_primal_residual) {
    dVar1 = (primal_dual_errors->max_primal_residual).absolute_value;
    if (dVar1 <= excessive_residual_error) {
      if (dVar1 <= 1e-12) {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar5 = kVerbose;
        HVar4 = 0;
      }
      else {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar5 = kDetailed;
        HVar4 = HVar5;
      }
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar5 = kError;
      HVar4 = kWarning;
    }
    if (1 < iVar2) {
      HVar5 = HVar3;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar5,
                "PrDuErrors : %-9s Primal residual:           num = %7d; max = %9.4g; sum = %9.4g\n"
                ,(primal_dual_errors->max_primal_residual).absolute_value,
                primal_dual_errors->sum_primal_residual,value_adjective._M_dataplus._M_p,
                (ulong)(uint)primal_dual_errors->num_primal_residual);
  }
  if (-1 < primal_dual_errors->num_dual_residual) {
    dVar1 = (primal_dual_errors->max_dual_residual).absolute_value;
    if (dVar1 <= excessive_residual_error) {
      if (dVar1 <= 1e-12) {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar5 = kVerbose;
        HVar4 = 0;
      }
      else {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar5 = kDetailed;
        HVar4 = HVar5;
      }
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar5 = kError;
      HVar4 = kWarning;
    }
    if (1 < iVar2) {
      HVar5 = HVar3;
    }
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,HVar5,
                "PrDuErrors : %-9s Dual residual:             num = %7d; max = %9.4g; sum = %9.4g\n"
                ,(primal_dual_errors->max_dual_residual).absolute_value,
                primal_dual_errors->sum_dual_residual,value_adjective._M_dataplus._M_p,
                (ulong)(uint)primal_dual_errors->num_dual_residual);
  }
  std::__cxx11::string::~string((string *)&value_adjective);
  return HVar4;
}

Assistant:

HighsDebugStatus debugAnalysePrimalDualErrors(
    const HighsOptions& options, HighsPrimalDualErrors& primal_dual_errors) {
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const bool force_report = options.highs_debug_level >= kHighsDebugLevelCostly;
  if (primal_dual_errors.num_nonzero_basic_duals >= 0) {
    if (primal_dual_errors.num_nonzero_basic_duals > 0) {
      value_adjective = "Error";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kLogicalError;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Nonzero basic duals:       num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_nonzero_basic_duals,
        primal_dual_errors.max_nonzero_basic_dual,
        primal_dual_errors.sum_nonzero_basic_duals);
  }
  if (primal_dual_errors.num_off_bound_nonbasic >= 0) {
    if (primal_dual_errors.num_off_bound_nonbasic > 0) {
      value_adjective = "Error";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kLogicalError;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Off-bound nonbasic values: num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_off_bound_nonbasic,
        primal_dual_errors.max_off_bound_nonbasic,
        primal_dual_errors.sum_off_bound_nonbasic);
  }
  if (primal_dual_errors.num_primal_residual >= 0) {
    if (primal_dual_errors.max_primal_residual.absolute_value >
        excessive_residual_error) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (primal_dual_errors.max_primal_residual.absolute_value >
               large_residual_error) {
      value_adjective = "Large";
      report_level = HighsLogType::kDetailed;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Primal residual:           num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_primal_residual,
        primal_dual_errors.max_primal_residual.absolute_value,
        primal_dual_errors.sum_primal_residual);
  }
  if (primal_dual_errors.num_dual_residual >= 0) {
    if (primal_dual_errors.max_dual_residual.absolute_value >
        excessive_residual_error) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (primal_dual_errors.max_dual_residual.absolute_value >
               large_residual_error) {
      value_adjective = "Large";
      report_level = HighsLogType::kDetailed;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "";
      report_level = HighsLogType::kVerbose;
      return_status = HighsDebugStatus::kOk;
    }
    if (force_report) report_level = HighsLogType::kInfo;
    highsLogDev(
        options.log_options, report_level,
        "PrDuErrors : %-9s Dual residual:             num = %7" HIGHSINT_FORMAT
        "; "
        "max = %9.4g; sum = %9.4g\n",
        value_adjective.c_str(), primal_dual_errors.num_dual_residual,
        primal_dual_errors.max_dual_residual.absolute_value,
        primal_dual_errors.sum_dual_residual);
  }
  return return_status;
}